

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QDnsDomainNameRecord>::reallocateAndGrow
          (QArrayDataPointer<QDnsDomainNameRecord> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QDnsDomainNameRecord> *old)

{
  QDnsDomainNameRecord *pQVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  QDnsDomainNameRecord *pQVar4;
  bool bVar5;
  long lVar6;
  qsizetype qVar7;
  QDnsDomainNameRecord *other;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QArrayDataPointer<QDnsDomainNameRecord> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QDnsDomainNameRecord> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar7 = 0;
        lVar6 = 0;
      }
      else {
        qVar7 = pQVar2->alloc;
        lVar6 = (this->size - pQVar2->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3);
      }
      auVar8 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,8,qVar7 + n + lVar6,Grow);
      this->d = (Data *)auVar8._0_8_;
      this->ptr = (QDnsDomainNameRecord *)auVar8._8_8_;
      goto LAB_00238f9c;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QDnsDomainNameRecord *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar4 = local_48.ptr;
  if (this->size != 0) {
    lVar6 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    other = this->ptr;
    pQVar1 = other + lVar6;
    if ((old != (QArrayDataPointer<QDnsDomainNameRecord> *)0x0) || (bVar5)) {
      if ((lVar6 != 0) && (0 < lVar6)) {
        do {
          QDnsDomainNameRecord::QDnsDomainNameRecord(pQVar4 + local_48.size,other);
          other = other + 1;
          local_48.size = local_48.size + 1;
        } while (other < pQVar1);
      }
    }
    else if ((lVar6 != 0) && (0 < lVar6)) {
      do {
        QDnsDomainNameRecord::QDnsDomainNameRecord(pQVar4 + local_48.size,other);
        other = other + 1;
        local_48.size = local_48.size + 1;
      } while (other < pQVar1);
    }
  }
  pDVar3 = this->d;
  pQVar4 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar7 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar3;
  local_48.ptr = pQVar4;
  local_48.size = qVar7;
  if (old != (QArrayDataPointer<QDnsDomainNameRecord> *)0x0) {
    local_48.d = old->d;
    local_48.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pQVar4;
    local_48.size = old->size;
    old->size = qVar7;
  }
  ~QArrayDataPointer(&local_48);
LAB_00238f9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }